

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O1

N_Vector N_VNew_MultiFab(sunindextype length,BoxArray *ba,DistributionMapping *dm,sunindextype nComp
                        ,sunindextype nGhost)

{
  void *pvVar1;
  N_Vector p_Var2;
  MultiFab *this;
  FabFactory<amrex::FArrayBox> local_60;
  MFInfo local_58;
  
  p_Var2 = N_VNewEmpty_MultiFab(length);
  if (p_Var2 == (N_Vector)0x0) {
    p_Var2 = (N_Vector)0x0;
  }
  else if (0 < length) {
    this = (MultiFab *)operator_new(0x180);
    local_58.alloc = true;
    local_58._1_7_ = 0;
    local_58.arena = (Arena *)0x0;
    local_58.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
    amrex::MultiFab::MultiFab(this,ba,dm,nComp,nGhost,&local_58,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    pvVar1 = p_Var2->content;
    *(undefined4 *)((long)pvVar1 + 4) = 1;
    *(MultiFab **)((long)pvVar1 + 8) = this;
  }
  return p_Var2;
}

Assistant:

N_Vector N_VNew_MultiFab(sunindextype length,
                            const amrex::BoxArray &ba,
                            const amrex::DistributionMapping &dm,
                            sunindextype nComp,
                            sunindextype nGhost)
{
    N_Vector v;

    v = NULL;
    v = N_VNewEmpty_MultiFab(length);
    if (v == NULL) return(NULL);

    // Create and attach new MultiFab
    if (length > 0)
    {
         amrex::MultiFab *mf_v = new amrex::MultiFab(ba, dm, nComp, nGhost);
         amrex::sundials::N_VSetOwnMF_MultiFab(v, SUNTRUE);
         amrex::sundials::getMFptr(v)     = mf_v;
    }

    return(v);
}